

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_set_variant_types(bcf1_t *b)

{
  variant_t *pvVar1;
  int local_1c;
  int i;
  bcf_dec_t *d;
  bcf1_t *b_local;
  
  if ((b->unpacked & 1U) == 0) {
    bcf_unpack(b,1);
  }
  if ((b->d).n_var < (int)((uint)((ulong)*(undefined8 *)&b->field_0x10 >> 0x10) & 0xffff)) {
    pvVar1 = (variant_t *)
             realloc((b->d).var,
                     (ulong)((uint)((ulong)*(undefined8 *)&b->field_0x10 >> 0x10) & 0xffff) << 3);
    (b->d).var = pvVar1;
    (b->d).n_var = (uint)((ulong)*(undefined8 *)&b->field_0x10 >> 0x10) & 0xffff;
  }
  (b->d).var_type = 0;
  for (local_1c = 1; local_1c < (int)((uint)((ulong)*(undefined8 *)&b->field_0x10 >> 0x10) & 0xffff)
      ; local_1c = local_1c + 1) {
    bcf_set_variant_type(*(b->d).allele,(b->d).allele[local_1c],(b->d).var + local_1c);
    (b->d).var_type = (b->d).var[local_1c].type | (b->d).var_type;
  }
  return;
}

Assistant:

static void bcf_set_variant_types(bcf1_t *b)
{
    if ( !(b->unpacked & BCF_UN_STR) ) bcf_unpack(b, BCF_UN_STR);
    bcf_dec_t *d = &b->d;
    if ( d->n_var < b->n_allele )
    {
        d->var = (variant_t *) realloc(d->var, sizeof(variant_t)*b->n_allele);
        d->n_var = b->n_allele;
    }
    int i;
    b->d.var_type = 0;
    for (i=1; i<b->n_allele; i++)
    {
        bcf_set_variant_type(d->allele[0],d->allele[i], &d->var[i]);
        b->d.var_type |= d->var[i].type;
        //fprintf(stderr,"[set_variant_type] %d   %s %s -> %d %d .. %d\n", b->pos+1,d->allele[0],d->allele[i],d->var[i].type,d->var[i].n, b->d.var_type);
    }
}